

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O2

void __thiscall mock_buffer<int>::mock_buffer(mock_buffer<int> *this,int *data)

{
  (this->super_basic_buffer<int>).capacity_ = 0;
  (this->super_basic_buffer<int>).ptr_ = (int *)0x0;
  (this->super_basic_buffer<int>).size_ = 0;
  (this->super_basic_buffer<int>)._vptr_basic_buffer = (_func_int **)&PTR_grow_001b6638;
  testing::internal::FunctionMocker<void_(unsigned_long)>::FunctionMocker(&this->gmock1_do_grow_94);
  (this->super_basic_buffer<int>).ptr_ = data;
  (this->super_basic_buffer<int>).capacity_ = 0;
  return;
}

Assistant:

mock_buffer(T *data) { this->set(data, 0); }